

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

void __thiscall google::protobuf::io::Tokenizer::~Tokenizer(Tokenizer *this)

{
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x94) < *(int *)(in_RDI + 0x90)) {
    (**(code **)(**(long **)(in_RDI + 0x70) + 0x18))
              (*(long **)(in_RDI + 0x70),*(int *)(in_RDI + 0x90) - *(int *)(in_RDI + 0x94));
  }
  Token::~Token((Token *)0x569773);
  Token::~Token((Token *)0x56977d);
  return;
}

Assistant:

Tokenizer::~Tokenizer() {
  // If we had any buffer left unread, return it to the underlying stream
  // so that someone else can read it.
  if (buffer_size_ > buffer_pos_) {
    input_->BackUp(buffer_size_ - buffer_pos_);
  }
}